

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

void __thiscall V2Osc::set(V2Osc *this,syVOsc *para)

{
  float fVar1;
  
  this->mode = (int)para->mode;
  this->ring = (bool)((byte)(int)para->ring & 1);
  this->pitch = (para->detune + -64.0) * 0.0078125 + para->pitch + -64.0;
  chgPitch(this);
  this->gain = para->gain * 0.0078125;
  fVar1 = para->color * 0.0078125;
  this->brpt = (int)(fVar1 * 2.1474836e+09) * 2;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  this->nfres = 1.0 - fVar1;
  return;
}

Assistant:

void set(const syVOsc *para)
    {
        mode = (int)para->mode;
        ring = (((int)para->ring) & 1) != 0;

        pitch = (para->pitch - 64.0f) + (para->detune - 64.0f) / 128.0f;
        chgPitch();
        gain = para->gain / 128.0f;

        float col = para->color / 128.0f;
        brpt = ftou32(col);
        nfres = 1.0f - sqrtf(col);
    }